

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExplosionDescriptor.cpp
# Opt level: O0

bool __thiscall
DIS::ExplosionDescriptor::operator==(ExplosionDescriptor *this,ExplosionDescriptor *rhs)

{
  bool local_19;
  bool ivarsEqual;
  ExplosionDescriptor *rhs_local;
  ExplosionDescriptor *this_local;
  
  local_19 = EntityType::operator==(&this->_explodingObject,&rhs->_explodingObject);
  if (this->_explosiveMaterial != rhs->_explosiveMaterial) {
    local_19 = false;
  }
  if (this->_padding != rhs->_padding) {
    local_19 = false;
  }
  if ((this->_explosiveForce != rhs->_explosiveForce) ||
     (NAN(this->_explosiveForce) || NAN(rhs->_explosiveForce))) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool ExplosionDescriptor::operator ==(const ExplosionDescriptor& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_explodingObject == rhs._explodingObject) ) ivarsEqual = false;
     if( ! (_explosiveMaterial == rhs._explosiveMaterial) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;
     if( ! (_explosiveForce == rhs._explosiveForce) ) ivarsEqual = false;

    return ivarsEqual;
 }